

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# download.cc
# Opt level: O3

int download(char *url,char *save_path)

{
  int iVar1;
  http_t *info;
  FILE *pFVar2;
  time_t tVar3;
  undefined8 uVar4;
  char *__format;
  char acStack_828 [2032];
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  if (save_path == (char *)0x0 || url == (char *)0x0) {
    return -1;
  }
  info = (http_t *)calloc(1,0x3148);
  if (info == (http_t *)0x0) {
    printf("[%s][%s(%d)]:malloc failed\n","MSG_ERROR","download",0x1e5);
    return -1;
  }
  info->sock = -1;
  info->save_path = save_path;
  iVar1 = parser_URL(url,info);
  if (((iVar1 == -1) || (iVar1 = connect_server(info), iVar1 == -1)) ||
     (iVar1 = send_request(info), iVar1 == -1)) goto LAB_00105071;
  pFVar2 = fdopen(info->sock,"r");
  info->in = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    __format = "[%s][%s(%d)]:fdopen error\n";
    uVar4 = 0x201;
  }
  else {
    iVar1 = parse_http_header(info);
    if (iVar1 == -1) goto LAB_00105071;
    iVar1 = info->status_code;
    if (iVar1 != 0x194) {
      if (iVar1 == 0x12e) {
        printf("[%s][%s(%d)]:redirect: %s\n","MSG_INFO","download",0x218,info->location);
        strncpy(acStack_828,info->location,0x7ff);
        clean_up(info);
        iVar1 = download(acStack_828,save_path);
        return iVar1;
      }
      if (iVar1 == 200) {
        tVar3 = time((time_t *)0x0);
        info->start_recv_time = tVar3;
        iVar1 = recv_response(info);
        if (iVar1 != -1) {
          tVar3 = time((time_t *)0x0);
          info->end_recv_time = tVar3;
          printf("[%s][%s(%d)]:recv %d bytes\n","MSG_INFO","download",0x214,
                 (ulong)(uint)info->recv_data_len);
          iVar1 = (int)info->end_recv_time - (int)info->start_recv_time;
          printf("[%s][%s(%d)]:Average download speed: %.2fKB/s\n",
                 SUB84((double)(((float)info->recv_data_len /
                                (float)(int)(iVar1 + (uint)(iVar1 == 0))) / 1000.0),0),"MSG_INFO",
                 "download",0x216);
          clean_up(info);
          return 0;
        }
      }
      else {
        printf("[%s][%s(%d)]:Not supported http code %d\n","MSG_INFO","download",0x221);
      }
      goto LAB_00105071;
    }
    __format = "[%s][%s(%d)]:Page not found\n";
    uVar4 = 0x21d;
  }
  printf(__format,"MSG_ERROR","download",uVar4);
LAB_00105071:
  clean_up(info);
  return -1;
}

Assistant:

int download(const char *url, const char *save_path) {
  http_t *info = NULL;
  char tmp[URI_MAX_LEN] = {0};

  if (!url || !save_path) return -1;

  // Initialization structure
  info = (http_t *)malloc(sizeof(http_t));
  if (!info) {
    lprintf(MSG_ERROR, "malloc failed\n");
    return -1;
  }
  memset(info, 0x0, sizeof(http_t));
  info->sock = -1;
  info->save_path = (char *)save_path;

  // resolve url
  if (-1 == parser_URL((char *)url, info)) {
    clean_up(info);
    return -1;
  }

  // Connect to server
  if (-1 == connect_server(info)) {
    clean_up(info);
    return -1;
  }

  // Send HTTP request message
  if (-1 == send_request(info)) {
    clean_up(info);
    return -1;
  }

  // Receiving the header information of the response
  info->in = fdopen(info->sock, "r");
  if (!info->in) {
    lprintf(MSG_ERROR, "fdopen error\n");
    clean_up(info);
    return -1;
  }

  // Analytical Head
  if (-1 == parse_http_header(info)) {
    clean_up(info);
    return -1;
  }
  if (info->status_code == HTTP_OK) {
    lprintf(MSG_DEBUG, "recv data now\n");
    info->start_recv_time = time(0);
    if (-1 == recv_response(info)) {
      clean_up(info);
      return -1;
    }

    info->end_recv_time = time(0);
    lprintf(MSG_INFO, "recv %d bytes\n", info->recv_data_len);
    lprintf(MSG_INFO, "Average download speed: %.2fKB/s\n",
            calc_download_speed(info) / 1000);
  } else if (info->status_code == HTTP_REDIRECT) {
    lprintf(MSG_INFO, "redirect: %s\n", info->location);
    strncpy(tmp, info->location, URI_MAX_LEN - 1);
    clean_up(info);
    return download(tmp, save_path);
  } else if (info->status_code == HTTP_NOT_FOUND) {
    lprintf(MSG_ERROR, "Page not found\n");
    clean_up(info);
    return -1;
  } else {
    lprintf(MSG_INFO, "Not supported http code %d\n", info->status_code);
    clean_up(info);
    return -1;
  }

  clean_up(info);
  return 0;
}